

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::CreateProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  const_reference ppcVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string filename;
  string projectName;
  allocator local_39;
  undefined1 local_38 [8];
  string outputDir;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  outputDir.field_2._8_8_ = lgs;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                       outputDir.field_2._8_8_,0);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)((long)&filename.field_2 + 8),*ppcVar1);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"/");
  std::operator+(&local_b0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,".sublime-project");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  CreateNewProjectFile
            (this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                  outputDir.field_2._8_8_,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateProjectFile(
                                     const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir=lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName=lgs[0]->GetProjectName();

  const std::string filename =
                     outputDir + "/" + projectName + ".sublime-project";

  this->CreateNewProjectFile(lgs, filename);
}